

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TonkineseTools.cpp
# Opt level: O3

bool __thiscall tonk::Timer::IsExpired(Timer *this,uint64_t nowUsec)

{
  uint uVar1;
  
  if ((this->IsTicking == true) && (this->UsecPerDivision <= nowUsec - this->WaitStartUsec)) {
    uVar1 = this->DivisionsExpired + 1;
    this->DivisionsExpired = uVar1;
    if (1 < uVar1) {
      if (this->ResetBehavior == Stop) {
        this->IsTicking = false;
      }
      this->WaitStartUsec = nowUsec;
      this->DivisionsExpired = 0;
      return true;
    }
    this->WaitStartUsec = nowUsec;
  }
  return false;
}

Assistant:

bool Timer::IsExpired(uint64_t nowUsec)
{
    if (!IsTicking) {
        return false;
    }

    const uint64_t elapsedUsec = static_cast<uint64_t>(nowUsec - WaitStartUsec);

    // If not enough time has elapsed yet:
    if (elapsedUsec < UsecPerDivision) {
        return false;
    }

    // If we haven't hit the 4rth tick yet:
    if (++DivisionsExpired < kTickDivisions)
    {
        // Use the latest timestamp and wait again
        WaitStartUsec = nowUsec;
        return false;
    }

    if (ResetBehavior == Behavior::Stop) {
        IsTicking = false;
    }

    WaitStartUsec = nowUsec;
    DivisionsExpired = 0;
    return true;
}